

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

void resizetab(lua_State *L,GCtab *t,uint32_t asize,uint32_t hbits)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  TValue *pTVar8;
  anon_struct_8_2_fd66bcdd_for_TValue_2 *paVar9;
  ulong uVar10;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  void *in_RDI;
  Node *n_1;
  uint32_t i_3;
  global_State *g_1;
  uint32_t i_2;
  TValue *array_1;
  global_State *g;
  TValue *oarray;
  uint32_t i;
  TValue *array;
  uint32_t oldhmask;
  uint32_t oldasize;
  Node *oldnode;
  Node *n;
  Node *node_1;
  uint32_t hmask;
  uint32_t i_1;
  Node *node;
  uint32_t hsize;
  ErrMsg in_stack_fffffffffffffedc;
  lua_State *in_stack_fffffffffffffee0;
  MSize osz;
  void *in_stack_fffffffffffffee8;
  lua_State *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  uint uVar11;
  GCtab *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  uint local_d4;
  void *local_d0;
  uint local_8c;
  
  uVar1 = *(uint *)(in_RSI + 0x14);
  uVar11 = *(uint *)(in_RSI + 0x18);
  uVar2 = *(uint *)(in_RSI + 0x1c);
  if (uVar11 < in_EDX) {
    if (0x8000001 < in_EDX) {
      lj_err_msg(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    }
    osz = (MSize)((ulong)in_stack_fffffffffffffee0 >> 0x20);
    if (*(char *)(in_RSI + 7) < '\x01') {
      local_d0 = lj_mem_realloc(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,osz,
                                (MSize)in_stack_fffffffffffffee0);
    }
    else {
      uVar3 = *(uint *)(in_RSI + 8);
      local_d0 = lj_mem_realloc(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,osz,
                                (MSize)in_stack_fffffffffffffee0);
      *(byte *)(in_RSI + 7) = *(byte *)(in_RSI + 7) | 0x80;
      for (local_d4 = 0; local_d4 < uVar11; local_d4 = local_d4 + 1) {
        *(undefined8 *)((long)local_d0 + (ulong)local_d4 * 8) =
             *(undefined8 *)((ulong)uVar3 + (ulong)local_d4 * 8);
      }
    }
    *(int *)(in_RSI + 8) = (int)local_d0;
    *(uint *)(in_RSI + 0x18) = in_EDX;
    for (local_d4 = uVar11; local_d4 < in_EDX; local_d4 = local_d4 + 1) {
      *(undefined4 *)((long)local_d0 + (ulong)local_d4 * 8 + 4) = 0xffffffff;
    }
  }
  if (in_ECX == 0) {
    *(int *)(in_RSI + 0x14) = *(int *)((long)in_RDI + 8) + 0x68;
    *(undefined4 *)(in_RSI + 0x1c) = 0;
  }
  else {
    if (0x1a < in_ECX) {
      lj_err_msg(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    }
    iVar5 = 1 << ((byte)in_ECX & 0x1f);
    pvVar6 = lj_mem_realloc(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                            (MSize)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                            (MSize)in_stack_fffffffffffffee0);
    *(int *)((long)pvVar6 + 0x14) = (int)pvVar6 + iVar5 * 0x18;
    *(int *)(in_RSI + 0x14) = (int)pvVar6;
    *(int *)(in_RSI + 0x1c) = iVar5 + -1;
    uVar3 = *(uint *)(in_RSI + 0x1c);
    uVar4 = *(uint *)(in_RSI + 0x14);
    for (local_8c = 0; local_8c <= uVar3; local_8c = local_8c + 1) {
      lVar7 = (ulong)uVar4 + (ulong)local_8c * 0x18;
      *(undefined4 *)(lVar7 + 0x10) = 0;
      *(undefined4 *)(lVar7 + 0xc) = 0xffffffff;
      *(undefined4 *)(lVar7 + 4) = 0xffffffff;
    }
  }
  if (in_EDX < uVar11) {
    uVar3 = *(uint *)(in_RSI + 8);
    *(uint *)(in_RSI + 0x18) = in_EDX;
    for (in_stack_ffffffffffffff0c = in_EDX; in_stack_ffffffffffffff0c < uVar11;
        in_stack_ffffffffffffff0c = in_stack_ffffffffffffff0c + 1) {
      if (*(int *)((ulong)uVar3 + 4 + (ulong)in_stack_ffffffffffffff0c * 8) != -1) {
        in_stack_fffffffffffffee8 = in_RDI;
        pTVar8 = lj_tab_setinth((lua_State *)
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                (GCtab *)in_stack_fffffffffffffef0,(int32_t)((ulong)in_RDI >> 0x20))
        ;
        *pTVar8 = *(TValue *)((ulong)uVar3 + (ulong)in_stack_ffffffffffffff0c * 8);
      }
    }
    if (*(char *)(in_RSI + 7) < '\x01') {
      pvVar6 = lj_mem_realloc(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                              (MSize)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                              (MSize)in_stack_fffffffffffffee0);
      *(int *)(in_RSI + 8) = (int)pvVar6;
    }
  }
  if (uVar2 != 0) {
    for (uVar11 = 0; uVar11 <= uVar2; uVar11 = uVar11 + 1) {
      paVar9 = (anon_struct_8_2_fd66bcdd_for_TValue_2 *)((ulong)uVar1 + (ulong)uVar11 * 0x18);
      if (paVar9->it != 0xffffffff) {
        pTVar8 = lj_tab_set((lua_State *)
                            CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                            in_stack_ffffffffffffff00,
                            (cTValue *)CONCAT44(uVar11,in_stack_fffffffffffffef8));
        pTVar8->field_2 = *paVar9;
      }
    }
    uVar10 = (ulong)*(uint *)((long)in_RDI + 8);
    lVar7 = (ulong)(uVar2 + 1) * 0x18;
    *(int *)(uVar10 + 0x20) = *(int *)(uVar10 + 0x20) - (int)lVar7;
    (**(code **)(uVar10 + 0x10))(*(undefined8 *)(uVar10 + 0x18),(ulong)uVar1,lVar7,0);
  }
  return;
}

Assistant:

static void resizetab(lua_State *L, GCtab *t, uint32_t asize, uint32_t hbits)
{
  Node *oldnode = noderef(t->node);
  uint32_t oldasize = t->asize;
  uint32_t oldhmask = t->hmask;
  if (asize > oldasize) {  /* Array part grows? */
    TValue *array;
    uint32_t i;
    if (asize > LJ_MAX_ASIZE)
      lj_err_msg(L, LJ_ERR_TABOV);
    if (LJ_MAX_COLOSIZE != 0 && t->colo > 0) {
      /* A colocated array must be separated and copied. */
      TValue *oarray = tvref(t->array);
      array = lj_mem_newvec(L, asize, TValue);
      t->colo = (int8_t)(t->colo | 0x80);  /* Mark as separated (colo < 0). */
      for (i = 0; i < oldasize; i++)
	copyTV(L, &array[i], &oarray[i]);
    } else {
      array = (TValue *)lj_mem_realloc(L, tvref(t->array),
			  oldasize*sizeof(TValue), asize*sizeof(TValue));
    }
    setmref(t->array, array);
    t->asize = asize;
    for (i = oldasize; i < asize; i++)  /* Clear newly allocated slots. */
      setnilV(&array[i]);
  }
  /* Create new (empty) hash part. */
  if (hbits) {
    newhpart(L, t, hbits);
    clearhpart(t);
  } else {
    global_State *g = G(L);
    setmref(t->node, &g->nilnode);
    t->hmask = 0;
  }
  if (asize < oldasize) {  /* Array part shrinks? */
    TValue *array = tvref(t->array);
    uint32_t i;
    t->asize = asize;  /* Note: This 'shrinks' even colocated arrays. */
    for (i = asize; i < oldasize; i++)  /* Reinsert old array values. */
      if (!tvisnil(&array[i]))
	copyTV(L, lj_tab_setinth(L, t, (int32_t)i), &array[i]);
    /* Physically shrink only separated arrays. */
    if (LJ_MAX_COLOSIZE != 0 && t->colo <= 0)
      setmref(t->array, lj_mem_realloc(L, array,
	      oldasize*sizeof(TValue), asize*sizeof(TValue)));
  }
  if (oldhmask > 0) {  /* Reinsert pairs from old hash part. */
    global_State *g;
    uint32_t i;
    for (i = 0; i <= oldhmask; i++) {
      Node *n = &oldnode[i];
      if (!tvisnil(&n->val))
	copyTV(L, lj_tab_set(L, t, &n->key), &n->val);
    }
    g = G(L);
    lj_mem_freevec(g, oldnode, oldhmask+1, Node);
  }
}